

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

double google::protobuf::io::Tokenizer::ParseFloat(string *text)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  LogMessage *pLVar4;
  LogFinisher local_9a;
  byte local_99;
  string local_98;
  byte local_61;
  LogMessage local_60;
  double local_28;
  double result;
  char *end;
  char *start;
  string *text_local;
  
  start = (char *)text;
  end = (char *)std::__cxx11::string::c_str();
  local_28 = NoLocaleStrtod(end,(char **)&result);
  if (((*(char *)result == 'e') || (pcVar1 = (char *)result, *(char *)result == 'E')) &&
     ((pcVar1 = (char *)((long)result + 1), *pcVar1 == '-' || (*pcVar1 == '+')))) {
    pcVar1 = (char *)((long)result + 2);
  }
  result = (double)pcVar1;
  if ((*(char *)result == 'f') || (*(char *)result == 'F')) {
    result = (double)((long)result + 1);
  }
  lVar2 = (long)result - (long)end;
  lVar3 = std::__cxx11::string::size();
  local_61 = 0;
  local_99 = 0;
  if ((lVar2 != lVar3) || (*end == '-')) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x3cc);
    local_61 = 1;
    pLVar4 = internal::LogMessage::operator<<
                       (&local_60,
                        " Tokenizer::ParseFloat() passed text that could not have been tokenized as a float: "
                       );
    CEscape(&local_98,(string *)start);
    local_99 = 1;
    pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_98);
    internal::LogFinisher::operator=(&local_9a,pLVar4);
  }
  if ((local_99 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  return local_28;
}

Assistant:

double Tokenizer::ParseFloat(const std::string& text) {
  const char* start = text.c_str();
  char* end;
  double result = NoLocaleStrtod(start, &end);

  // "1e" is not a valid float, but if the tokenizer reads it, it will
  // report an error but still return it as a valid token.  We need to
  // accept anything the tokenizer could possibly return, error or not.
  if (*end == 'e' || *end == 'E') {
    ++end;
    if (*end == '-' || *end == '+') ++end;
  }

  // If the Tokenizer had allow_f_after_float_ enabled, the float may be
  // suffixed with the letter 'f'.
  if (*end == 'f' || *end == 'F') {
    ++end;
  }

  GOOGLE_LOG_IF(DFATAL,
         static_cast<size_t>(end - start) != text.size() || *start == '-')
      << " Tokenizer::ParseFloat() passed text that could not have been"
         " tokenized as a float: "
      << CEscape(text);
  return result;
}